

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::QName::getRawName(QName *this)

{
  XMLCh *pXVar1;
  XMLSize_t XVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLSize_t XVar4;
  XMLCh *src;
  ulong uVar5;
  XMLCh **ppXVar6;
  
  ppXVar6 = &this->fRawName;
  pXVar1 = this->fRawName;
  if ((pXVar1 == (XMLCh *)0x0) || (*pXVar1 == L'\0')) {
    src = this->fPrefix;
    if (*src == L'\0') {
      ppXVar6 = &this->fLocalPart;
    }
    else {
      XVar4 = this->fPrefixBufSz;
      XVar2 = this->fLocalPartBufSz;
      uVar5 = XVar2 + XVar4 + 1;
      if ((pXVar1 == (XMLCh *)0x0) || (this->fRawNameBufSz < uVar5)) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
        this->fRawName = (XMLCh *)0x0;
        this->fRawNameBufSz = uVar5;
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,(XVar2 + XVar4) * 2 + 4);
        this->fRawName = (XMLCh *)CONCAT44(extraout_var,iVar3);
        *(XMLCh *)CONCAT44(extraout_var,iVar3) = L'\0';
        src = this->fPrefix;
      }
      XVar4 = XMLString::stringLen(src);
      memmove(this->fRawName,this->fPrefix,XVar4 * 2);
      pXVar1 = this->fRawName;
      pXVar1[XVar4] = L':';
      XMLString::copyString(pXVar1 + XVar4 + 1,this->fLocalPart);
    }
  }
  return *ppXVar6;
}

Assistant:

XMLCh* QName::getRawName()
{
    //
    //  If there is no buffer, or if there is but we've not faulted in the
    //  value yet, then we have to do that now.
    //
    if (!fRawName || !*fRawName)
    {
        //
        //  If we have a prefix, then do the prefix:name version. Else, its
        //  just the name.
        //
        if (*fPrefix)
        {
            //
            //  Calculate the worst case size buffer we will need. We use the
            //  current high water marks of the prefix and name buffers, so it
            //  might be a little wasteful of memory but we don't have to do
            //  string len operations on the two strings.
            //
            const XMLSize_t neededLen = fPrefixBufSz + fLocalPartBufSz + 1;

            //
            //  If no buffer, or the current one is too small, then allocate one
            //  and get rid of any old one.
            //
            if (!fRawName || (neededLen > fRawNameBufSz))
            {
                fMemoryManager->deallocate(fRawName); //delete [] fRawName;
                
                fRawName = 0;
                // We have to cast off the const'ness to do this
                (const_cast<QName*>(this))->fRawNameBufSz = neededLen;
                (const_cast<QName*>(this))->fRawName = (XMLCh*) fMemoryManager->allocate
                (
                    (neededLen + 1) * sizeof(XMLCh)
                ); //new XMLCh[neededLen + 1];

                // Make sure its initially empty
                *fRawName = 0;
            }


            const XMLSize_t prefixLen = XMLString::stringLen(fPrefix);

            XMLString::moveChars(fRawName, fPrefix, prefixLen);
            fRawName[prefixLen] = chColon;
            XMLString::copyString(&fRawName[prefixLen+1], fLocalPart);
        }
         else
        {
            return fLocalPart;
        }
    }
    return fRawName;
}